

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *iEnd;
  BYTE *pBVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  BYTE *pBVar8;
  ZSTD_matchState_t *pZVar9;
  ulong *mEnd;
  BYTE *pBVar10;
  U32 *pUVar11;
  U32 *pUVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  undefined8 uVar16;
  char cVar17;
  uint uVar18;
  ulong *puVar19;
  ulong uVar20;
  size_t sVar21;
  BYTE *pBVar22;
  byte bVar23;
  byte bVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong *puVar27;
  long lVar28;
  ulong *puVar29;
  BYTE *litEnd_4;
  ulong uVar30;
  ulong *puVar31;
  U32 UVar32;
  U32 UVar33;
  U32 UVar34;
  BYTE *litEnd;
  uint uVar35;
  BYTE *iStart;
  ulong uVar36;
  long lVar37;
  int *piVar38;
  seqDef *psVar39;
  ulong uVar40;
  BYTE *pBVar41;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  ulong uVar45;
  U32 UVar46;
  uint uVar47;
  ulong uVar48;
  U32 UVar49;
  int iVar50;
  BYTE *base;
  char *_ptr;
  ulong uVar51;
  uint uVar52;
  uint uVar53;
  BYTE *litEnd_1;
  ulong *puVar54;
  U32 prefixStartIndex;
  U32 dictIndexDelta;
  BYTE *litLimit_w_6;
  BYTE *litLimit_w;
  BYTE *iend;
  BYTE *ilimit;
  BYTE *prefixStart;
  BYTE *dictBase;
  BYTE *dictEnd;
  U32 *hashTable;
  BYTE *dictStart;
  U32 dictStartIndex;
  
  uVar4 = (ms->cParams).targetLength;
  uVar44 = (ulong)(uVar4 + (uVar4 == 0));
  pBVar8 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar8 + uVar4;
  iEnd = (ulong *)((long)src + srcSize);
  puVar19 = (ulong *)((long)src + (srcSize - 8));
  pZVar9 = ms->dictMatchState;
  uVar5 = (pZVar9->window).dictLimit;
  mEnd = (ulong *)(pZVar9->window).nextSrc;
  pBVar10 = (pZVar9->window).base;
  pBVar41 = pBVar10 + uVar5;
  uVar42 = ((int)pBVar10 - (int)mEnd) + uVar4;
  iVar14 = ((int)src - (int)iStart) + (int)mEnd;
  iVar15 = (int)pBVar41;
  pUVar11 = pZVar9->hashTable;
  uVar18 = (pZVar9->cParams).hashLog;
  uVar52 = (ms->cParams).minMatch;
  pUVar12 = ms->hashTable;
  iVar6 = ms->prefetchCDictTables;
  UVar46 = *rep;
  UVar34 = rep[1];
  bVar23 = (byte)uVar18;
  iVar50 = (int)pBVar8;
  cVar17 = (char)(ms->cParams).hashLog;
  if (uVar52 == 5) {
    if ((iVar6 != 0) && (uVar18 < 0x3e)) {
      uVar40 = 0;
      do {
        uVar40 = uVar40 + 0x40;
      } while (uVar40 < (ulong)(4L << (bVar23 & 0x3f)));
    }
    puVar25 = (ulong *)((long)src + uVar44);
    if (puVar25 <= puVar19) {
      bVar24 = 0x40 - cVar17;
      puVar1 = iEnd + -4;
      puVar31 = (ulong *)((long)src + (ulong)(iVar14 == iVar15));
LAB_01908d45:
      uVar26 = *puVar31 * -0x30e4432345000000;
      uVar48 = uVar26 >> (0x38 - bVar23 & 0x3f);
      uVar51 = (ulong)pUVar11[uVar48 >> 8];
      uVar48 = uVar48 ^ uVar51;
      puVar27 = puVar31 + 0x20;
      uVar40 = uVar44;
LAB_01908d7d:
      uVar36 = uVar26 >> (bVar24 & 0x3f);
      uVar18 = pUVar12[uVar36];
      uVar20 = (ulong)uVar18;
      uVar30 = (long)puVar31 - (long)pBVar8;
      UVar33 = (U32)uVar30;
      uVar52 = (UVar33 - UVar46) + 1;
      uVar26 = *puVar25 * -0x30e4432345000000;
      uVar45 = uVar26 >> (0x38 - bVar23 & 0x3f);
      pUVar12[uVar36] = UVar33;
      if ((uVar4 - 1) - uVar52 < 3) {
LAB_01908dfa:
        puVar29 = puVar31;
        if ((char)uVar48 == '\0') {
          uVar48 = uVar51 >> 8;
          uVar52 = (uint)(uVar51 >> 8);
          if (((uVar5 < uVar52) && (*(int *)(pBVar10 + uVar48) == (int)*puVar31)) &&
             (uVar18 <= uVar4)) {
            sVar21 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar31 + 4),pBVar10 + uVar48 + 4,(BYTE *)iEnd,
                                (BYTE *)mEnd,iStart);
            lVar37 = sVar21 + 4;
            if (puVar31 <= src) goto LAB_01909276;
            pBVar22 = pBVar10 + (uVar48 - 1);
            goto LAB_0190906b;
          }
        }
        if ((uVar4 < uVar18) && (piVar38 = (int *)(pBVar8 + uVar20), *piVar38 == (int)*puVar31))
        goto LAB_01908f24;
        uVar40 = (uVar40 + 1) - (ulong)(puVar25 < puVar27);
        if (puVar19 < (ulong *)((long)puVar25 + uVar40)) goto LAB_01909d78;
        puVar27 = puVar27 + (ulong)(puVar27 <= puVar25) * 0x20;
        uVar51 = (ulong)pUVar11[uVar45 >> 8];
        uVar48 = uVar45 ^ uVar51;
        puVar31 = puVar25;
        puVar25 = (ulong *)((long)puVar25 + uVar40);
        goto LAB_01908d7d;
      }
      piVar38 = (int *)(pBVar8 + uVar52);
      if (uVar52 < uVar4) {
        piVar38 = (int *)(pBVar10 + (uVar52 - uVar42));
      }
      if (*piVar38 != *(int *)((long)puVar31 + 1)) goto LAB_01908dfa;
      puVar29 = (ulong *)((long)puVar31 + 1);
      puVar25 = iEnd;
      if (uVar52 < uVar4) {
        puVar25 = mEnd;
      }
      sVar21 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar31 + 5),(BYTE *)(piVar38 + 1),(BYTE *)iEnd,
                          (BYTE *)puVar25,iStart);
      uVar40 = (long)puVar29 - (long)src;
      puVar25 = (ulong *)seqStore->lit;
      if (puVar1 < puVar29) {
        ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
        goto LAB_01908ef2;
      }
      uVar26 = *(ulong *)((long)src + 8);
      *puVar25 = *src;
      puVar25[1] = uVar26;
      pBVar22 = seqStore->lit;
      if (uVar40 < 0x11) {
        seqStore->lit = pBVar22 + uVar40;
        psVar39 = seqStore->sequences;
      }
      else {
        uVar26 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
        *(ulong *)(pBVar22 + 0x18) = uVar26;
        if (0x20 < (long)uVar40) {
          lVar37 = 0;
          do {
            puVar3 = (undefined8 *)((long)src + lVar37 + 0x20);
            uVar16 = puVar3[1];
            pBVar2 = pBVar22 + lVar37 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar16;
            puVar3 = (undefined8 *)((long)src + lVar37 + 0x30);
            uVar16 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar16;
            lVar37 = lVar37 + 0x20;
          } while (pBVar2 + 0x20 < pBVar22 + uVar40);
        }
LAB_01908ef2:
        seqStore->lit = seqStore->lit + uVar40;
        psVar39 = seqStore->sequences;
        if (0xffff < uVar40) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      lVar37 = sVar21 + 4;
      psVar39->litLength = (U16)uVar40;
      psVar39->offBase = 1;
      uVar40 = sVar21 + 1;
      UVar32 = UVar46;
      goto LAB_01909360;
    }
  }
  else if (uVar52 == 6) {
    if ((iVar6 != 0) && (uVar18 < 0x3e)) {
      uVar40 = 0;
      do {
        uVar40 = uVar40 + 0x40;
      } while (uVar40 < (ulong)(4L << (bVar23 & 0x3f)));
    }
    puVar25 = (ulong *)((long)src + uVar44);
    if (puVar25 <= puVar19) {
      bVar24 = 0x40 - cVar17;
      puVar1 = iEnd + -4;
      puVar31 = (ulong *)((long)src + (ulong)(iVar14 == iVar15));
LAB_019084bf:
      uVar26 = *puVar31 * -0x30e4432340650000;
      uVar48 = uVar26 >> (0x38 - bVar23 & 0x3f);
      uVar51 = (ulong)pUVar11[uVar48 >> 8];
      uVar48 = uVar48 ^ uVar51;
      puVar27 = puVar31 + 0x20;
      uVar40 = uVar44;
LAB_019084f7:
      uVar36 = uVar26 >> (bVar24 & 0x3f);
      uVar18 = pUVar12[uVar36];
      uVar20 = (ulong)uVar18;
      uVar30 = (long)puVar31 - (long)pBVar8;
      UVar33 = (U32)uVar30;
      uVar52 = (UVar33 - UVar46) + 1;
      uVar26 = *puVar25 * -0x30e4432340650000;
      uVar45 = uVar26 >> (0x38 - bVar23 & 0x3f);
      pUVar12[uVar36] = UVar33;
      if ((uVar4 - 1) - uVar52 < 3) {
LAB_0190856c:
        puVar29 = puVar31;
        if ((char)uVar48 == '\0') {
          uVar48 = uVar51 >> 8;
          uVar52 = (uint)(uVar51 >> 8);
          if (((uVar5 < uVar52) && (*(int *)(pBVar10 + uVar48) == (int)*puVar31)) &&
             (uVar18 <= uVar4)) {
            sVar21 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar31 + 4),pBVar10 + uVar48 + 4,(BYTE *)iEnd,
                                (BYTE *)mEnd,iStart);
            lVar37 = sVar21 + 4;
            if (puVar31 <= src) goto LAB_019089cf;
            pBVar22 = pBVar10 + (uVar48 - 1);
            goto LAB_019087d2;
          }
        }
        if ((uVar4 < uVar18) && (piVar38 = (int *)(pBVar8 + uVar20), *piVar38 == (int)*puVar31))
        goto LAB_01908690;
        uVar40 = (uVar40 + 1) - (ulong)(puVar25 < puVar27);
        if (puVar19 < (ulong *)((long)puVar25 + uVar40)) goto LAB_01909d78;
        puVar27 = puVar27 + (ulong)(puVar27 <= puVar25) * 0x20;
        uVar51 = (ulong)pUVar11[uVar45 >> 8];
        uVar48 = uVar45 ^ uVar51;
        puVar31 = puVar25;
        puVar25 = (ulong *)((long)puVar25 + uVar40);
        goto LAB_019084f7;
      }
      piVar38 = (int *)(pBVar8 + uVar52);
      if (uVar52 < uVar4) {
        piVar38 = (int *)(pBVar10 + (uVar52 - uVar42));
      }
      if (*piVar38 != *(int *)((long)puVar31 + 1)) goto LAB_0190856c;
      puVar29 = (ulong *)((long)puVar31 + 1);
      puVar25 = iEnd;
      if (uVar52 < uVar4) {
        puVar25 = mEnd;
      }
      sVar21 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar31 + 5),(BYTE *)(piVar38 + 1),(BYTE *)iEnd,
                          (BYTE *)puVar25,iStart);
      uVar40 = (long)puVar29 - (long)src;
      puVar25 = (ulong *)seqStore->lit;
      if (puVar1 < puVar29) {
        ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
        goto LAB_0190865e;
      }
      uVar26 = *(ulong *)((long)src + 8);
      *puVar25 = *src;
      puVar25[1] = uVar26;
      pBVar22 = seqStore->lit;
      if (uVar40 < 0x11) {
        seqStore->lit = pBVar22 + uVar40;
        psVar39 = seqStore->sequences;
      }
      else {
        uVar26 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
        *(ulong *)(pBVar22 + 0x18) = uVar26;
        if (0x20 < (long)uVar40) {
          lVar37 = 0;
          do {
            puVar3 = (undefined8 *)((long)src + lVar37 + 0x20);
            uVar16 = puVar3[1];
            pBVar2 = pBVar22 + lVar37 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar16;
            puVar3 = (undefined8 *)((long)src + lVar37 + 0x30);
            uVar16 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar16;
            lVar37 = lVar37 + 0x20;
          } while (pBVar2 + 0x20 < pBVar22 + uVar40);
        }
LAB_0190865e:
        seqStore->lit = seqStore->lit + uVar40;
        psVar39 = seqStore->sequences;
        if (0xffff < uVar40) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      lVar37 = sVar21 + 4;
      psVar39->litLength = (U16)uVar40;
      psVar39->offBase = 1;
      uVar40 = sVar21 + 1;
      UVar32 = UVar46;
      goto LAB_01908aaf;
    }
  }
  else if (uVar52 == 7) {
    if ((iVar6 != 0) && (uVar18 < 0x3e)) {
      uVar40 = 0;
      do {
        uVar40 = uVar40 + 0x40;
      } while (uVar40 < (ulong)(4L << (bVar23 & 0x3f)));
    }
    puVar25 = (ulong *)((long)src + uVar44);
    if (puVar25 <= puVar19) {
      bVar24 = 0x40 - cVar17;
      puVar1 = iEnd + -4;
      puVar31 = (ulong *)((long)src + (ulong)(iVar14 == iVar15));
LAB_01907c27:
      uVar26 = *puVar31 * -0x30e44323405a9d00;
      uVar48 = uVar26 >> (0x38 - bVar23 & 0x3f);
      uVar51 = (ulong)pUVar11[uVar48 >> 8];
      uVar48 = uVar48 ^ uVar51;
      puVar27 = puVar31 + 0x20;
      uVar40 = uVar44;
LAB_01907c5f:
      uVar36 = uVar26 >> (bVar24 & 0x3f);
      uVar18 = pUVar12[uVar36];
      uVar20 = (ulong)uVar18;
      uVar30 = (long)puVar31 - (long)pBVar8;
      UVar33 = (U32)uVar30;
      uVar52 = (UVar33 - UVar46) + 1;
      uVar26 = *puVar25 * -0x30e44323405a9d00;
      uVar45 = uVar26 >> (0x38 - bVar23 & 0x3f);
      pUVar12[uVar36] = UVar33;
      if ((uVar4 - 1) - uVar52 < 3) {
LAB_01907cd4:
        puVar29 = puVar31;
        if ((char)uVar48 == '\0') {
          uVar48 = uVar51 >> 8;
          uVar52 = (uint)(uVar51 >> 8);
          if (((uVar5 < uVar52) && (*(int *)(pBVar10 + uVar48) == (int)*puVar31)) &&
             (uVar18 <= uVar4)) {
            sVar21 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar31 + 4),pBVar10 + uVar48 + 4,(BYTE *)iEnd,
                                (BYTE *)mEnd,iStart);
            lVar37 = sVar21 + 4;
            if (puVar31 <= src) goto LAB_01908137;
            pBVar22 = pBVar10 + (uVar48 - 1);
            goto LAB_01907f3a;
          }
        }
        if ((uVar4 < uVar18) && (piVar38 = (int *)(pBVar8 + uVar20), *piVar38 == (int)*puVar31))
        goto LAB_01907df8;
        uVar40 = (uVar40 + 1) - (ulong)(puVar25 < puVar27);
        if (puVar19 < (ulong *)((long)puVar25 + uVar40)) goto LAB_01909d78;
        puVar27 = puVar27 + (ulong)(puVar27 <= puVar25) * 0x20;
        uVar51 = (ulong)pUVar11[uVar45 >> 8];
        uVar48 = uVar45 ^ uVar51;
        puVar31 = puVar25;
        puVar25 = (ulong *)((long)puVar25 + uVar40);
        goto LAB_01907c5f;
      }
      piVar38 = (int *)(pBVar8 + uVar52);
      if (uVar52 < uVar4) {
        piVar38 = (int *)(pBVar10 + (uVar52 - uVar42));
      }
      if (*piVar38 != *(int *)((long)puVar31 + 1)) goto LAB_01907cd4;
      puVar29 = (ulong *)((long)puVar31 + 1);
      puVar25 = iEnd;
      if (uVar52 < uVar4) {
        puVar25 = mEnd;
      }
      sVar21 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar31 + 5),(BYTE *)(piVar38 + 1),(BYTE *)iEnd,
                          (BYTE *)puVar25,iStart);
      uVar40 = (long)puVar29 - (long)src;
      puVar25 = (ulong *)seqStore->lit;
      if (puVar1 < puVar29) {
        ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
        goto LAB_01907dc6;
      }
      uVar26 = *(ulong *)((long)src + 8);
      *puVar25 = *src;
      puVar25[1] = uVar26;
      pBVar22 = seqStore->lit;
      if (uVar40 < 0x11) {
        seqStore->lit = pBVar22 + uVar40;
        psVar39 = seqStore->sequences;
      }
      else {
        uVar26 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
        *(ulong *)(pBVar22 + 0x18) = uVar26;
        if (0x20 < (long)uVar40) {
          lVar37 = 0;
          do {
            puVar3 = (undefined8 *)((long)src + lVar37 + 0x20);
            uVar16 = puVar3[1];
            pBVar2 = pBVar22 + lVar37 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar16;
            puVar3 = (undefined8 *)((long)src + lVar37 + 0x30);
            uVar16 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar16;
            lVar37 = lVar37 + 0x20;
          } while (pBVar2 + 0x20 < pBVar22 + uVar40);
        }
LAB_01907dc6:
        seqStore->lit = seqStore->lit + uVar40;
        psVar39 = seqStore->sequences;
        if (0xffff < uVar40) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      lVar37 = sVar21 + 4;
      psVar39->litLength = (U16)uVar40;
      psVar39->offBase = 1;
      uVar40 = sVar21 + 1;
      UVar32 = UVar46;
      goto LAB_01908217;
    }
  }
  else {
    if ((iVar6 != 0) && (uVar18 < 0x3e)) {
      uVar40 = 0;
      do {
        uVar40 = uVar40 + 0x40;
      } while (uVar40 < (ulong)(4L << (bVar23 & 0x3f)));
    }
    puVar25 = (ulong *)((long)src + uVar44);
    if (puVar25 <= puVar19) {
      bVar24 = 0x20 - cVar17;
      puVar1 = iEnd + -4;
      puVar31 = (ulong *)((long)src + (ulong)(iVar14 == iVar15));
LAB_019095f8:
      uVar52 = (int)*puVar31 * -0x61c8864f;
      uVar47 = uVar52 >> (0x18 - bVar23 & 0x1f);
      uVar18 = pUVar11[uVar47 >> 8];
      uVar47 = uVar47 ^ uVar18;
      puVar27 = puVar31 + 0x20;
      uVar40 = uVar44;
LAB_01909630:
      uVar35 = uVar52 >> (bVar24 & 0x1f);
      uVar7 = pUVar12[uVar35];
      uVar26 = (ulong)uVar7;
      UVar33 = (U32)((long)puVar31 - (long)pBVar8);
      uVar53 = (UVar33 - UVar46) + 1;
      uVar52 = (int)*puVar25 * -0x61c8864f;
      uVar43 = uVar52 >> (0x18 - bVar23 & 0x1f);
      pUVar12[uVar35] = UVar33;
      if ((uVar4 - 1) - uVar53 < 3) {
LAB_0190969f:
        puVar29 = puVar31;
        if ((char)uVar47 == '\0') {
          uVar18 = uVar18 >> 8;
          if (((uVar5 < uVar18) && (*(int *)(pBVar10 + uVar18) == (int)*puVar31)) &&
             (uVar7 <= uVar4)) {
            sVar21 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar31 + 4),pBVar10 + (ulong)uVar18 + 4,(BYTE *)iEnd
                                ,(BYTE *)mEnd,iStart);
            lVar37 = sVar21 + 4;
            if (puVar31 <= src) goto LAB_01909af6;
            pBVar22 = pBVar10 + ((ulong)uVar18 - 1);
            goto LAB_019098ff;
          }
        }
        if ((uVar4 < uVar7) && (piVar38 = (int *)(pBVar8 + uVar26), *piVar38 == (int)*puVar31))
        goto LAB_019097bd;
        uVar40 = (uVar40 + 1) - (ulong)(puVar25 < puVar27);
        if (puVar19 < (ulong *)((long)puVar25 + uVar40)) goto LAB_01909d78;
        puVar27 = puVar27 + (ulong)(puVar27 <= puVar25) * 0x20;
        uVar18 = pUVar11[uVar43 >> 8];
        uVar47 = uVar43 ^ uVar18;
        puVar31 = puVar25;
        puVar25 = (ulong *)((long)puVar25 + uVar40);
        goto LAB_01909630;
      }
      piVar38 = (int *)(pBVar8 + uVar53);
      if (uVar53 < uVar4) {
        piVar38 = (int *)(pBVar10 + (uVar53 - uVar42));
      }
      if (*piVar38 != *(int *)((long)puVar31 + 1)) goto LAB_0190969f;
      puVar29 = (ulong *)((long)puVar31 + 1);
      puVar25 = iEnd;
      if (uVar53 < uVar4) {
        puVar25 = mEnd;
      }
      sVar21 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar31 + 5),(BYTE *)(piVar38 + 1),(BYTE *)iEnd,
                          (BYTE *)puVar25,iStart);
      uVar40 = (long)puVar29 - (long)src;
      puVar25 = (ulong *)seqStore->lit;
      if (puVar1 < puVar29) {
        ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
        goto LAB_0190978b;
      }
      uVar26 = *(ulong *)((long)src + 8);
      *puVar25 = *src;
      puVar25[1] = uVar26;
      pBVar22 = seqStore->lit;
      if (uVar40 < 0x11) {
        seqStore->lit = pBVar22 + uVar40;
        psVar39 = seqStore->sequences;
      }
      else {
        uVar26 = *(ulong *)((long)src + 0x18);
        *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
        *(ulong *)(pBVar22 + 0x18) = uVar26;
        if (0x20 < (long)uVar40) {
          lVar37 = 0;
          do {
            puVar3 = (undefined8 *)((long)src + lVar37 + 0x20);
            uVar16 = puVar3[1];
            pBVar2 = pBVar22 + lVar37 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar16;
            puVar3 = (undefined8 *)((long)src + lVar37 + 0x30);
            uVar16 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar16;
            lVar37 = lVar37 + 0x20;
          } while (pBVar2 + 0x20 < pBVar22 + uVar40);
        }
LAB_0190978b:
        seqStore->lit = seqStore->lit + uVar40;
        psVar39 = seqStore->sequences;
        if (0xffff < uVar40) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      lVar37 = sVar21 + 4;
      psVar39->litLength = (U16)uVar40;
      psVar39->offBase = 1;
      uVar40 = sVar21 + 1;
      goto LAB_01909bcc;
    }
  }
LAB_01909d78:
  *rep = UVar46;
  rep[1] = UVar34;
  return (long)iEnd - (long)src;
  while (bVar13 = pBVar41 < pBVar22, pBVar22 = pBVar22 + -1, puVar31 = puVar25, bVar13) {
LAB_0190906b:
    puVar25 = (ulong *)((long)puVar31 + -1);
    puVar29 = puVar31;
    if ((*(BYTE *)puVar25 != *pBVar22) || (lVar37 = lVar37 + 1, puVar29 = puVar25, puVar25 <= src))
    break;
  }
LAB_01909276:
  uVar40 = (long)puVar29 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar1 < puVar29) {
    ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
LAB_019092a5:
    seqStore->lit = seqStore->lit + uVar40;
    psVar39 = seqStore->sequences;
    if (0xffff < uVar40) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar22 = seqStore->lit;
    if (0x10 < uVar40) {
      uVar26 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar22 + 0x18) = uVar26;
      if (0x20 < (long)uVar40) {
        lVar28 = 0;
        do {
          puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
          uVar16 = puVar3[1];
          pBVar2 = pBVar22 + lVar28 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar16;
          puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
          uVar16 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar16;
          lVar28 = lVar28 + 0x20;
        } while (pBVar2 + 0x20 < pBVar22 + uVar40);
      }
      goto LAB_019092a5;
    }
    seqStore->lit = pBVar22 + uVar40;
    psVar39 = seqStore->sequences;
  }
  piVar38 = (int *)(ulong)(uVar52 + uVar42);
  puVar31 = (ulong *)(uVar30 & 0xffffffff);
LAB_0190934a:
  UVar32 = (int)puVar31 - (int)piVar38;
  psVar39->litLength = (U16)uVar40;
  psVar39->offBase = UVar32 + 3;
  uVar40 = lVar37 - 3;
  UVar34 = UVar46;
LAB_01909360:
  if (0xffff < uVar40) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)(lVar37 + (long)puVar29);
  psVar39->mlBase = (U16)uVar40;
  seqStore->sequences = psVar39 + 1;
  UVar46 = UVar32;
  if (src <= puVar19) {
    pUVar12[(ulong)(*(long *)(pBVar8 + (uVar30 & 0xffffffff) + 2) * -0x30e4432345000000) >>
            (bVar24 & 0x3f)] = UVar33 + 2;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar24 & 0x3f)] =
         ((int)src + -2) - iVar50;
    do {
      UVar49 = UVar34;
      UVar46 = UVar32;
      UVar33 = (int)src - iVar50;
      uVar18 = UVar33 - UVar49;
      pBVar22 = pBVar8;
      if (uVar18 < uVar4) {
        pBVar22 = pBVar10 + -(ulong)uVar42;
      }
      UVar34 = UVar49;
      if (((uVar4 - 1) - uVar18 < 3) || (*(int *)(pBVar22 + uVar18) != (int)*src)) break;
      puVar25 = iEnd;
      if (uVar18 < uVar4) {
        puVar25 = mEnd;
      }
      sVar21 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar22 + uVar18) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar25,iStart);
      puVar25 = (ulong *)seqStore->lit;
      if (puVar1 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)src,(BYTE *)puVar1);
      }
      else {
        uVar40 = *(ulong *)((long)src + 8);
        *puVar25 = *src;
        puVar25[1] = uVar40;
      }
      psVar39 = seqStore->sequences;
      psVar39->litLength = 0;
      psVar39->offBase = 1;
      if (0xffff < sVar21 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar39->mlBase = (U16)(sVar21 + 1);
      seqStore->sequences = psVar39 + 1;
      pUVar12[*src * -0x30e4432345000000 >> (bVar24 & 0x3f)] = UVar33;
      src = (void *)((long)src + sVar21 + 4);
      UVar32 = UVar49;
      UVar34 = UVar46;
      UVar46 = UVar49;
    } while (src <= puVar19);
  }
  puVar25 = (ulong *)((long)src + uVar44);
  puVar31 = (ulong *)src;
  if (puVar19 < puVar25) goto LAB_01909d78;
  goto LAB_01908d45;
LAB_01908f24:
  puVar25 = (ulong *)((long)puVar31 + 4);
  puVar27 = (ulong *)(piVar38 + 1);
  puVar54 = puVar25;
  if (puVar25 < (ulong *)((long)iEnd + -7)) {
    if (*puVar27 == *puVar25) {
      lVar37 = 0;
      do {
        puVar27 = (ulong *)((long)puVar31 + lVar37 + 0xc);
        if ((ulong *)((long)iEnd + -7) <= puVar27) {
          puVar27 = (ulong *)(pBVar8 + lVar37 + uVar20 + 0xc);
          puVar54 = (ulong *)((long)puVar31 + lVar37 + 0xc);
          goto LAB_019090f8;
        }
        lVar28 = lVar37 + uVar20 + 0xc;
        uVar40 = *puVar27;
        lVar37 = lVar37 + 8;
      } while (*(ulong *)(pBVar8 + lVar28) == uVar40);
      uVar40 = uVar40 ^ *(ulong *)(pBVar8 + lVar28);
      uVar26 = 0;
      if (uVar40 != 0) {
        for (; (uVar40 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
        }
      }
      uVar40 = (uVar26 >> 3 & 0x1fffffff) + lVar37;
    }
    else {
      uVar26 = *puVar25 ^ *puVar27;
      uVar40 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar40 = uVar40 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_019090f8:
    if ((puVar54 < (ulong *)((long)iEnd + -3)) && ((int)*puVar27 == (int)*puVar54)) {
      puVar54 = (ulong *)((long)puVar54 + 4);
      puVar27 = (ulong *)((long)puVar27 + 4);
    }
    if ((puVar54 < (ulong *)((long)iEnd + -1)) && ((short)*puVar27 == (short)*puVar54)) {
      puVar54 = (ulong *)((long)puVar54 + 2);
      puVar27 = (ulong *)((long)puVar27 + 2);
    }
    if (puVar54 < iEnd) {
      puVar54 = (ulong *)((long)puVar54 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar54));
    }
    uVar40 = (long)puVar54 - (long)puVar25;
  }
  lVar37 = uVar40 + 4;
  if (src < puVar31) {
    pBVar22 = pBVar8 + (uVar20 - 1);
    do {
      puVar25 = (ulong *)((long)puVar29 + -1);
      if ((*(BYTE *)puVar25 != *pBVar22) || (lVar37 = lVar37 + 1, puVar29 = puVar25, puVar25 <= src)
         ) break;
      bVar13 = iStart < pBVar22;
      pBVar22 = pBVar22 + -1;
    } while (bVar13);
  }
  uVar40 = (long)puVar29 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar1 < puVar29) {
    ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar22 = seqStore->lit;
    if (uVar40 < 0x11) {
      seqStore->lit = pBVar22 + uVar40;
      psVar39 = seqStore->sequences;
      goto LAB_0190934a;
    }
    uVar26 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar22 + 0x18) = uVar26;
    if (0x20 < (long)uVar40) {
      lVar28 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
        uVar16 = puVar3[1];
        pBVar2 = pBVar22 + lVar28 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar16;
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
        uVar16 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar16;
        lVar28 = lVar28 + 0x20;
      } while (pBVar2 + 0x20 < pBVar22 + uVar40);
    }
  }
  seqStore->lit = seqStore->lit + uVar40;
  psVar39 = seqStore->sequences;
  if (0xffff < uVar40) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
  }
  goto LAB_0190934a;
  while (bVar13 = pBVar41 < pBVar22, pBVar22 = pBVar22 + -1, puVar31 = puVar25, bVar13) {
LAB_019087d2:
    puVar25 = (ulong *)((long)puVar31 + -1);
    puVar29 = puVar31;
    if ((*(BYTE *)puVar25 != *pBVar22) || (lVar37 = lVar37 + 1, puVar29 = puVar25, puVar25 <= src))
    break;
  }
LAB_019089cf:
  uVar40 = (long)puVar29 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar1 < puVar29) {
    ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
LAB_019089f9:
    seqStore->lit = seqStore->lit + uVar40;
    psVar39 = seqStore->sequences;
    if (0xffff < uVar40) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar22 = seqStore->lit;
    if (0x10 < uVar40) {
      uVar26 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar22 + 0x18) = uVar26;
      if (0x20 < (long)uVar40) {
        lVar28 = 0;
        do {
          puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
          uVar16 = puVar3[1];
          pBVar2 = pBVar22 + lVar28 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar16;
          puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
          uVar16 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar16;
          lVar28 = lVar28 + 0x20;
        } while (pBVar2 + 0x20 < pBVar22 + uVar40);
      }
      goto LAB_019089f9;
    }
    seqStore->lit = pBVar22 + uVar40;
    psVar39 = seqStore->sequences;
  }
  piVar38 = (int *)(ulong)(uVar52 + uVar42);
  puVar31 = (ulong *)(uVar30 & 0xffffffff);
LAB_01908a99:
  UVar32 = (int)puVar31 - (int)piVar38;
  psVar39->litLength = (U16)uVar40;
  psVar39->offBase = UVar32 + 3;
  uVar40 = lVar37 - 3;
  UVar34 = UVar46;
LAB_01908aaf:
  if (0xffff < uVar40) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)(lVar37 + (long)puVar29);
  psVar39->mlBase = (U16)uVar40;
  seqStore->sequences = psVar39 + 1;
  UVar46 = UVar32;
  if (src <= puVar19) {
    pUVar12[(ulong)(*(long *)(pBVar8 + (uVar30 & 0xffffffff) + 2) * -0x30e4432340650000) >>
            (bVar24 & 0x3f)] = UVar33 + 2;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar24 & 0x3f)] =
         ((int)src + -2) - iVar50;
    do {
      UVar49 = UVar34;
      UVar46 = UVar32;
      UVar33 = (int)src - iVar50;
      uVar18 = UVar33 - UVar49;
      pBVar22 = pBVar8;
      if (uVar18 < uVar4) {
        pBVar22 = pBVar10 + -(ulong)uVar42;
      }
      UVar34 = UVar49;
      if (((uVar4 - 1) - uVar18 < 3) || (*(int *)(pBVar22 + uVar18) != (int)*src)) break;
      puVar25 = iEnd;
      if (uVar18 < uVar4) {
        puVar25 = mEnd;
      }
      sVar21 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar22 + uVar18) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar25,iStart);
      puVar25 = (ulong *)seqStore->lit;
      if (puVar1 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)src,(BYTE *)puVar1);
      }
      else {
        uVar40 = *(ulong *)((long)src + 8);
        *puVar25 = *src;
        puVar25[1] = uVar40;
      }
      psVar39 = seqStore->sequences;
      psVar39->litLength = 0;
      psVar39->offBase = 1;
      if (0xffff < sVar21 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar39->mlBase = (U16)(sVar21 + 1);
      seqStore->sequences = psVar39 + 1;
      pUVar12[*src * -0x30e4432340650000 >> (bVar24 & 0x3f)] = UVar33;
      src = (void *)((long)src + sVar21 + 4);
      UVar32 = UVar49;
      UVar34 = UVar46;
      UVar46 = UVar49;
    } while (src <= puVar19);
  }
  puVar25 = (ulong *)((long)src + uVar44);
  puVar31 = (ulong *)src;
  if (puVar19 < puVar25) goto LAB_01909d78;
  goto LAB_019084bf;
LAB_01908690:
  puVar25 = (ulong *)((long)puVar31 + 4);
  puVar27 = (ulong *)(piVar38 + 1);
  puVar54 = puVar25;
  if (puVar25 < (ulong *)((long)iEnd + -7)) {
    if (*puVar27 == *puVar25) {
      lVar37 = 0;
      do {
        puVar27 = (ulong *)((long)puVar31 + lVar37 + 0xc);
        if ((ulong *)((long)iEnd + -7) <= puVar27) {
          puVar27 = (ulong *)(pBVar8 + lVar37 + uVar20 + 0xc);
          puVar54 = (ulong *)((long)puVar31 + lVar37 + 0xc);
          goto LAB_0190885b;
        }
        lVar28 = lVar37 + uVar20 + 0xc;
        uVar40 = *puVar27;
        lVar37 = lVar37 + 8;
      } while (*(ulong *)(pBVar8 + lVar28) == uVar40);
      uVar40 = uVar40 ^ *(ulong *)(pBVar8 + lVar28);
      uVar26 = 0;
      if (uVar40 != 0) {
        for (; (uVar40 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
        }
      }
      uVar40 = (uVar26 >> 3 & 0x1fffffff) + lVar37;
    }
    else {
      uVar26 = *puVar25 ^ *puVar27;
      uVar40 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar40 = uVar40 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_0190885b:
    if ((puVar54 < (ulong *)((long)iEnd + -3)) && ((int)*puVar27 == (int)*puVar54)) {
      puVar54 = (ulong *)((long)puVar54 + 4);
      puVar27 = (ulong *)((long)puVar27 + 4);
    }
    if ((puVar54 < (ulong *)((long)iEnd + -1)) && ((short)*puVar27 == (short)*puVar54)) {
      puVar54 = (ulong *)((long)puVar54 + 2);
      puVar27 = (ulong *)((long)puVar27 + 2);
    }
    if (puVar54 < iEnd) {
      puVar54 = (ulong *)((long)puVar54 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar54));
    }
    uVar40 = (long)puVar54 - (long)puVar25;
  }
  lVar37 = uVar40 + 4;
  if (src < puVar31) {
    pBVar22 = pBVar8 + (uVar20 - 1);
    do {
      puVar25 = (ulong *)((long)puVar29 + -1);
      if ((*(BYTE *)puVar25 != *pBVar22) || (lVar37 = lVar37 + 1, puVar29 = puVar25, puVar25 <= src)
         ) break;
      bVar13 = iStart < pBVar22;
      pBVar22 = pBVar22 + -1;
    } while (bVar13);
  }
  uVar40 = (long)puVar29 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar1 < puVar29) {
    ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar22 = seqStore->lit;
    if (uVar40 < 0x11) {
      seqStore->lit = pBVar22 + uVar40;
      psVar39 = seqStore->sequences;
      goto LAB_01908a99;
    }
    uVar26 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar22 + 0x18) = uVar26;
    if (0x20 < (long)uVar40) {
      lVar28 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
        uVar16 = puVar3[1];
        pBVar2 = pBVar22 + lVar28 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar16;
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
        uVar16 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar16;
        lVar28 = lVar28 + 0x20;
      } while (pBVar2 + 0x20 < pBVar22 + uVar40);
    }
  }
  seqStore->lit = seqStore->lit + uVar40;
  psVar39 = seqStore->sequences;
  if (0xffff < uVar40) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
  }
  goto LAB_01908a99;
  while (bVar13 = pBVar41 < pBVar22, pBVar22 = pBVar22 + -1, bVar13) {
LAB_019098ff:
    puVar25 = (ulong *)((long)puVar29 + -1);
    if ((*(BYTE *)puVar25 != *pBVar22) || (lVar37 = lVar37 + 1, puVar29 = puVar25, puVar25 <= src))
    break;
  }
LAB_01909af6:
  uVar40 = (long)puVar29 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar1 < puVar29) {
    ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
LAB_01909b1b:
    seqStore->lit = seqStore->lit + uVar40;
    psVar39 = seqStore->sequences;
    if (0xffff < uVar40) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar22 = seqStore->lit;
    if (0x10 < uVar40) {
      uVar26 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar22 + 0x18) = uVar26;
      if (0x20 < (long)uVar40) {
        lVar28 = 0;
        do {
          puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
          uVar16 = puVar3[1];
          pBVar2 = pBVar22 + lVar28 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar16;
          puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
          uVar16 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar16;
          lVar28 = lVar28 + 0x20;
        } while (pBVar2 + 0x20 < pBVar22 + uVar40);
      }
      goto LAB_01909b1b;
    }
    seqStore->lit = pBVar22 + uVar40;
    psVar39 = seqStore->sequences;
  }
  UVar32 = UVar33 - (uVar18 + uVar42);
  psVar39->litLength = (U16)uVar40;
  psVar39->offBase = UVar32 + 3;
  goto LAB_01909bca;
LAB_019097bd:
  puVar25 = (ulong *)((long)puVar31 + 4);
  puVar27 = (ulong *)(piVar38 + 1);
  puVar54 = puVar25;
  if (puVar25 < (ulong *)((long)iEnd + -7)) {
    if (*puVar27 == *puVar25) {
      lVar37 = 0;
      do {
        puVar27 = (ulong *)((long)puVar31 + lVar37 + 0xc);
        if ((ulong *)((long)iEnd + -7) <= puVar27) {
          puVar27 = (ulong *)(pBVar8 + lVar37 + uVar26 + 0xc);
          puVar54 = (ulong *)((long)puVar31 + lVar37 + 0xc);
          goto LAB_01909983;
        }
        lVar28 = lVar37 + uVar26 + 0xc;
        uVar40 = *puVar27;
        lVar37 = lVar37 + 8;
      } while (*(ulong *)(pBVar8 + lVar28) == uVar40);
      uVar40 = uVar40 ^ *(ulong *)(pBVar8 + lVar28);
      uVar48 = 0;
      if (uVar40 != 0) {
        for (; (uVar40 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
        }
      }
      uVar40 = (uVar48 >> 3 & 0x1fffffff) + lVar37;
    }
    else {
      uVar48 = *puVar25 ^ *puVar27;
      uVar40 = 0;
      if (uVar48 != 0) {
        for (; (uVar48 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar40 = uVar40 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_01909983:
    if ((puVar54 < (ulong *)((long)iEnd + -3)) && ((int)*puVar27 == (int)*puVar54)) {
      puVar54 = (ulong *)((long)puVar54 + 4);
      puVar27 = (ulong *)((long)puVar27 + 4);
    }
    if ((puVar54 < (ulong *)((long)iEnd + -1)) && ((short)*puVar27 == (short)*puVar54)) {
      puVar54 = (ulong *)((long)puVar54 + 2);
      puVar27 = (ulong *)((long)puVar27 + 2);
    }
    if (puVar54 < iEnd) {
      puVar54 = (ulong *)((long)puVar54 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar54));
    }
    uVar40 = (long)puVar54 - (long)puVar25;
  }
  lVar37 = uVar40 + 4;
  if (src < puVar31) {
    pBVar22 = pBVar8 + (uVar26 - 1);
    do {
      puVar25 = (ulong *)((long)puVar29 + -1);
      if ((*(BYTE *)puVar25 != *pBVar22) || (lVar37 = lVar37 + 1, puVar29 = puVar25, puVar25 <= src)
         ) break;
      bVar13 = iStart < pBVar22;
      pBVar22 = pBVar22 + -1;
    } while (bVar13);
  }
  uVar40 = (long)puVar29 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar1 < puVar29) {
    ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
LAB_01909a44:
    seqStore->lit = seqStore->lit + uVar40;
    psVar39 = seqStore->sequences;
    if (0xffff < uVar40) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar22 = seqStore->lit;
    if (0x10 < uVar40) {
      uVar26 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar22 + 0x18) = uVar26;
      if (0x20 < (long)uVar40) {
        lVar28 = 0;
        do {
          puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
          uVar16 = puVar3[1];
          pBVar2 = pBVar22 + lVar28 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar16;
          puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
          uVar16 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar16;
          lVar28 = lVar28 + 0x20;
        } while (pBVar2 + 0x20 < pBVar22 + uVar40);
      }
      goto LAB_01909a44;
    }
    seqStore->lit = pBVar22 + uVar40;
    psVar39 = seqStore->sequences;
  }
  UVar32 = (int)puVar31 - (int)piVar38;
  psVar39->litLength = (U16)uVar40;
  psVar39->offBase = UVar32 + 3;
LAB_01909bca:
  uVar40 = lVar37 - 3;
  UVar34 = UVar46;
  UVar46 = UVar32;
LAB_01909bcc:
  if (0xffff < uVar40) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)(lVar37 + (long)puVar29);
  psVar39->mlBase = (U16)uVar40;
  seqStore->sequences = psVar39 + 1;
  if (src <= puVar19) {
    pUVar12[(uint)(*(int *)(pBVar8 + ((long)puVar31 - (long)pBVar8 & 0xffffffffU) + 2) * -0x61c8864f
                  ) >> (bVar24 & 0x1f)] = UVar33 + 2;
    pUVar12[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar24 & 0x1f)] =
         ((int)src + -2) - iVar50;
    do {
      UVar32 = UVar46;
      UVar33 = (int)src - iVar50;
      uVar18 = UVar33 - UVar34;
      pBVar22 = pBVar8;
      if (uVar18 < uVar4) {
        pBVar22 = pBVar10 + -(ulong)uVar42;
      }
      UVar46 = UVar32;
      if (((uVar4 - 1) - uVar18 < 3) || (*(int *)(pBVar22 + uVar18) != (int)*src)) break;
      puVar25 = iEnd;
      if (uVar18 < uVar4) {
        puVar25 = mEnd;
      }
      sVar21 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar22 + uVar18) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar25,iStart);
      puVar25 = (ulong *)seqStore->lit;
      if (puVar1 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)src,(BYTE *)puVar1);
      }
      else {
        uVar40 = *(ulong *)((long)src + 8);
        *puVar25 = *src;
        puVar25[1] = uVar40;
      }
      psVar39 = seqStore->sequences;
      psVar39->litLength = 0;
      psVar39->offBase = 1;
      if (0xffff < sVar21 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar39->mlBase = (U16)(sVar21 + 1);
      seqStore->sequences = psVar39 + 1;
      pUVar12[(uint)((int)*src * -0x61c8864f) >> (bVar24 & 0x1f)] = UVar33;
      src = (void *)((long)src + sVar21 + 4);
      UVar46 = UVar34;
      UVar34 = UVar32;
    } while (src <= puVar19);
  }
  puVar25 = (ulong *)((long)src + uVar44);
  puVar31 = (ulong *)src;
  if (puVar19 < puVar25) goto LAB_01909d78;
  goto LAB_019095f8;
  while (bVar13 = pBVar41 < pBVar22, pBVar22 = pBVar22 + -1, puVar31 = puVar25, bVar13) {
LAB_01907f3a:
    puVar25 = (ulong *)((long)puVar31 + -1);
    puVar29 = puVar31;
    if ((*(BYTE *)puVar25 != *pBVar22) || (lVar37 = lVar37 + 1, puVar29 = puVar25, puVar25 <= src))
    break;
  }
LAB_01908137:
  uVar40 = (long)puVar29 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar1 < puVar29) {
    ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
LAB_01908161:
    seqStore->lit = seqStore->lit + uVar40;
    psVar39 = seqStore->sequences;
    if (0xffff < uVar40) {
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar22 = seqStore->lit;
    if (0x10 < uVar40) {
      uVar26 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar22 + 0x18) = uVar26;
      if (0x20 < (long)uVar40) {
        lVar28 = 0;
        do {
          puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
          uVar16 = puVar3[1];
          pBVar2 = pBVar22 + lVar28 + 0x20;
          *(undefined8 *)pBVar2 = *puVar3;
          *(undefined8 *)(pBVar2 + 8) = uVar16;
          puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
          uVar16 = puVar3[1];
          *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
          *(undefined8 *)(pBVar2 + 0x18) = uVar16;
          lVar28 = lVar28 + 0x20;
        } while (pBVar2 + 0x20 < pBVar22 + uVar40);
      }
      goto LAB_01908161;
    }
    seqStore->lit = pBVar22 + uVar40;
    psVar39 = seqStore->sequences;
  }
  piVar38 = (int *)(ulong)(uVar52 + uVar42);
  puVar31 = (ulong *)(uVar30 & 0xffffffff);
LAB_01908201:
  UVar32 = (int)puVar31 - (int)piVar38;
  psVar39->litLength = (U16)uVar40;
  psVar39->offBase = UVar32 + 3;
  uVar40 = lVar37 - 3;
  UVar34 = UVar46;
LAB_01908217:
  if (0xffff < uVar40) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)(lVar37 + (long)puVar29);
  psVar39->mlBase = (U16)uVar40;
  seqStore->sequences = psVar39 + 1;
  UVar46 = UVar32;
  if (src <= puVar19) {
    pUVar12[(ulong)(*(long *)(pBVar8 + (uVar30 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
            (bVar24 & 0x3f)] = UVar33 + 2;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar24 & 0x3f)] =
         ((int)src + -2) - iVar50;
    do {
      UVar49 = UVar34;
      UVar46 = UVar32;
      UVar33 = (int)src - iVar50;
      uVar18 = UVar33 - UVar49;
      pBVar22 = pBVar8;
      if (uVar18 < uVar4) {
        pBVar22 = pBVar10 + -(ulong)uVar42;
      }
      UVar34 = UVar49;
      if (((uVar4 - 1) - uVar18 < 3) || (*(int *)(pBVar22 + uVar18) != (int)*src)) break;
      puVar25 = iEnd;
      if (uVar18 < uVar4) {
        puVar25 = mEnd;
      }
      sVar21 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar22 + uVar18) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar25,iStart);
      puVar25 = (ulong *)seqStore->lit;
      if (puVar1 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)src,(BYTE *)puVar1);
      }
      else {
        uVar40 = *(ulong *)((long)src + 8);
        *puVar25 = *src;
        puVar25[1] = uVar40;
      }
      psVar39 = seqStore->sequences;
      psVar39->litLength = 0;
      psVar39->offBase = 1;
      if (0xffff < sVar21 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar39->mlBase = (U16)(sVar21 + 1);
      seqStore->sequences = psVar39 + 1;
      pUVar12[*src * -0x30e44323405a9d00 >> (bVar24 & 0x3f)] = UVar33;
      src = (void *)((long)src + sVar21 + 4);
      UVar32 = UVar49;
      UVar34 = UVar46;
      UVar46 = UVar49;
    } while (src <= puVar19);
  }
  puVar25 = (ulong *)((long)src + uVar44);
  puVar31 = (ulong *)src;
  if (puVar19 < puVar25) goto LAB_01909d78;
  goto LAB_01907c27;
LAB_01907df8:
  puVar25 = (ulong *)((long)puVar31 + 4);
  puVar27 = (ulong *)(piVar38 + 1);
  puVar54 = puVar25;
  if (puVar25 < (ulong *)((long)iEnd - 7U)) {
    if (*puVar27 == *puVar25) {
      lVar37 = 0;
      do {
        puVar27 = (ulong *)((long)puVar31 + lVar37 + 0xc);
        if ((ulong *)((long)iEnd - 7U) <= puVar27) {
          puVar27 = (ulong *)(pBVar8 + lVar37 + uVar20 + 0xc);
          puVar54 = (ulong *)((long)puVar31 + lVar37 + 0xc);
          goto LAB_01907fc3;
        }
        lVar28 = lVar37 + uVar20 + 0xc;
        uVar40 = *puVar27;
        lVar37 = lVar37 + 8;
      } while (*(ulong *)(pBVar8 + lVar28) == uVar40);
      uVar40 = uVar40 ^ *(ulong *)(pBVar8 + lVar28);
      uVar26 = 0;
      if (uVar40 != 0) {
        for (; (uVar40 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
        }
      }
      uVar40 = (uVar26 >> 3 & 0x1fffffff) + lVar37;
    }
    else {
      uVar26 = *puVar25 ^ *puVar27;
      uVar40 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
        }
      }
      uVar40 = uVar40 >> 3 & 0x1fffffff;
    }
  }
  else {
LAB_01907fc3:
    if ((puVar54 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar27 == (int)*puVar54)) {
      puVar54 = (ulong *)((long)puVar54 + 4);
      puVar27 = (ulong *)((long)puVar27 + 4);
    }
    if ((puVar54 < (ulong *)((long)iEnd + -1)) && ((short)*puVar27 == (short)*puVar54)) {
      puVar54 = (ulong *)((long)puVar54 + 2);
      puVar27 = (ulong *)((long)puVar27 + 2);
    }
    if (puVar54 < iEnd) {
      puVar54 = (ulong *)((long)puVar54 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar54));
    }
    uVar40 = (long)puVar54 - (long)puVar25;
  }
  lVar37 = uVar40 + 4;
  if (src < puVar31) {
    pBVar22 = pBVar8 + (uVar20 - 1);
    do {
      puVar25 = (ulong *)((long)puVar29 + -1);
      if ((*(BYTE *)puVar25 != *pBVar22) || (lVar37 = lVar37 + 1, puVar29 = puVar25, puVar25 <= src)
         ) break;
      bVar13 = iStart < pBVar22;
      pBVar22 = pBVar22 + -1;
    } while (bVar13);
  }
  uVar40 = (long)puVar29 - (long)src;
  puVar25 = (ulong *)seqStore->lit;
  if (puVar1 < puVar29) {
    ZSTD_safecopyLiterals((BYTE *)puVar25,(BYTE *)src,(BYTE *)puVar29,(BYTE *)puVar1);
  }
  else {
    uVar26 = *(ulong *)((long)src + 8);
    *puVar25 = *src;
    puVar25[1] = uVar26;
    pBVar22 = seqStore->lit;
    if (uVar40 < 0x11) {
      seqStore->lit = pBVar22 + uVar40;
      psVar39 = seqStore->sequences;
      goto LAB_01908201;
    }
    uVar26 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar22 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar22 + 0x18) = uVar26;
    if (0x20 < (long)uVar40) {
      lVar28 = 0;
      do {
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x20);
        uVar16 = puVar3[1];
        pBVar2 = pBVar22 + lVar28 + 0x20;
        *(undefined8 *)pBVar2 = *puVar3;
        *(undefined8 *)(pBVar2 + 8) = uVar16;
        puVar3 = (undefined8 *)((long)src + lVar28 + 0x30);
        uVar16 = puVar3[1];
        *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
        *(undefined8 *)(pBVar2 + 0x18) = uVar16;
        lVar28 = lVar28 + 0x20;
      } while (pBVar2 + 0x20 < pBVar22 + uVar40);
    }
  }
  seqStore->lit = seqStore->lit + uVar40;
  psVar39 = seqStore->sequences;
  if (0xffff < uVar40) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar39 - (long)seqStore->sequencesStart) >> 3);
  }
  goto LAB_01908201;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}